

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_explain.cpp
# Opt level: O0

unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>,_true> __thiscall
duckdb::Transformer::TransformExplain(Transformer *this,PGExplainStmt *stmt)

{
  bool bVar1;
  PGDefElem *pPVar2;
  PGValue *pPVar3;
  undefined8 uVar4;
  long in_RDX;
  unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_> in_RDI;
  Value *in_stack_000000f0;
  Value val;
  string elem;
  char *def_name;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> def_elem;
  PGListCell *n;
  bool format_is_set;
  ExplainFormat explain_format;
  ExplainType explain_type;
  Transformer *in_stack_00000248;
  PGValue in_stack_00000250;
  string *in_stack_fffffffffffffdf8;
  Value *in_stack_fffffffffffffe00;
  Value *in_stack_fffffffffffffe08;
  Value *in_stack_fffffffffffffe10;
  allocator *paVar5;
  optional_ptr<duckdb_libpgquery::PGValue,_true> in_stack_fffffffffffffe30;
  Transformer *in_stack_fffffffffffffe38;
  ExplainType *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  string *msg;
  _Head_base<0UL,_duckdb::ExplainStatement_*,_false> this_00;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  PGValue *local_120;
  undefined8 local_118;
  ValUnion VStack_110;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [55];
  undefined1 local_79 [33];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  PGDefElem *local_30;
  long local_28;
  byte local_1b;
  ExplainFormat local_1a;
  undefined1 local_19;
  
  local_19 = 0;
  local_1a = DEFAULT;
  local_1b = 0;
  if (*(long *)(in_RDX + 0x10) != 0) {
    this_00._M_head_impl =
         (ExplainStatement *)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
         .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl;
    for (local_28 = *(long *)(*(long *)(in_RDX + 0x10) + 8); local_28 != 0;
        local_28 = *(long *)(local_28 + 8)) {
      local_30 = (PGDefElem *)PGPointerCast<duckdb_libpgquery::PGDefElem>(in_stack_fffffffffffffdf8)
      ;
      pPVar2 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->
                         ((optional_ptr<duckdb_libpgquery::PGDefElem,_true> *)
                          in_stack_fffffffffffffe00);
      params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar2->defname;
      msg = (string *)local_79;
      local_38 = params;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)(local_79 + 1),(char *)params,(allocator *)msg);
      StringUtil::Lower(in_stack_fffffffffffffe48);
      ::std::__cxx11::string::~string((string *)(local_79 + 1));
      ::std::allocator<char>::~allocator((allocator<char> *)local_79);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
      if (bVar1) {
        local_19 = 1;
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
        if (!bVar1) {
          uVar4 = __cxa_allocate_exception(0x10);
          paVar5 = &local_141;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_140,"Unimplemented explain type: %s",paVar5);
          ::std::__cxx11::string::string(local_168,local_58);
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    ((NotImplementedException *)this_00._M_head_impl,msg,params);
          __cxa_throw(uVar4,&NotImplementedException::typeinfo,
                      NotImplementedException::~NotImplementedException);
        }
        pPVar2 = optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->
                           ((optional_ptr<duckdb_libpgquery::PGDefElem,_true> *)
                            in_stack_fffffffffffffe00);
        if (pPVar2->arg != (PGNode *)0x0) {
          if ((local_1b & 1) != 0) {
            local_b2 = 1;
            uVar4 = __cxa_allocate_exception(0x10);
            paVar5 = &local_b1;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_b0,"FORMAT can not be provided more than once",paVar5);
            InvalidInputException::InvalidInputException
                      ((InvalidInputException *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8)
            ;
            local_b2 = 0;
            __cxa_throw(uVar4,&InvalidInputException::typeinfo,
                        InvalidInputException::~InvalidInputException);
          }
          in_stack_fffffffffffffe38 =
               (Transformer *)
               optional_ptr<duckdb_libpgquery::PGDefElem,_true>::operator->
                         ((optional_ptr<duckdb_libpgquery::PGDefElem,_true> *)
                          in_stack_fffffffffffffe00);
          in_stack_fffffffffffffe30 =
               PGPointerCast<duckdb_libpgquery::PGValue>(in_stack_fffffffffffffdf8);
          local_120 = in_stack_fffffffffffffe30.ptr;
          pPVar3 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator*
                             ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)
                              in_stack_fffffffffffffe00);
          local_118 = *(undefined8 *)pPVar3;
          VStack_110 = pPVar3->val;
          TransformValue(in_stack_00000248,in_stack_00000250);
          unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
          ::operator->((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                        *)in_stack_fffffffffffffe00);
          Value::Value(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
          ::~unique_ptr((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                         *)0xf2a37c);
          local_1b = 1;
          local_1a = ParseFormat(in_stack_000000f0);
          Value::~Value(in_stack_fffffffffffffe00);
        }
      }
      ::std::__cxx11::string::~string(local_58);
    }
  }
  TransformStatement(in_stack_fffffffffffffe38,(PGNode *)in_stack_fffffffffffffe30.ptr);
  make_uniq<duckdb::ExplainStatement,duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,duckdb::ExplainType&,duckdb::ExplainFormat&>
            ((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             (ExplainFormat *)in_stack_fffffffffffffe38);
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::~unique_ptr
            ((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             0xf2a5ad);
  return (unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>)
         (__uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ExplainStatement_*,_std::default_delete<duckdb::ExplainStatement>_>
         .super__Head_base<0UL,_duckdb::ExplainStatement_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ExplainStatement> Transformer::TransformExplain(duckdb_libpgquery::PGExplainStmt &stmt) {
	auto explain_type = ExplainType::EXPLAIN_STANDARD;
	auto explain_format = ExplainFormat::DEFAULT;
	bool format_is_set = false;
	if (stmt.options) {
		for (auto n = stmt.options->head; n; n = n->next) {
			auto def_elem = PGPointerCast<duckdb_libpgquery::PGDefElem>(n->data.ptr_value);
			auto def_name = def_elem->defname;
			auto elem = StringUtil::Lower(def_name);
			if (elem == "analyze") {
				explain_type = ExplainType::EXPLAIN_ANALYZE;
			} else if (elem == "format") {
				if (def_elem->arg) {
					if (format_is_set) {
						throw InvalidInputException("FORMAT can not be provided more than once");
					}
					auto val = TransformValue(*PGPointerCast<duckdb_libpgquery::PGValue>(def_elem->arg))->value;
					format_is_set = true;
					explain_format = ParseFormat(val);
				}
			} else {
				throw NotImplementedException("Unimplemented explain type: %s", elem);
			}
		}
	}
	return make_uniq<ExplainStatement>(TransformStatement(*stmt.query), explain_type, explain_format);
}